

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O0

size_type __thiscall absl::string_view::rfind(string_view *this,char c,size_type pos)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long local_38;
  string_view *local_30;
  size_type i;
  size_type pos_local;
  string_view *psStack_18;
  char c_local;
  string_view *this_local;
  
  i = pos;
  pos_local._7_1_ = c;
  psStack_18 = this;
  bVar1 = empty(this);
  if (bVar1) {
    this_local = (string_view *)0xffffffffffffffff;
  }
  else {
    local_38 = this->length_ - 1;
    puVar2 = std::min<unsigned_long>(&i,&local_38);
    for (local_30 = (string_view *)*puVar2;
        *(char *)((long)&local_30->ptr_ + (long)this->ptr_) != pos_local._7_1_;
        local_30 = (string_view *)((long)&local_30[-1].length_ + 7)) {
      if (local_30 == (string_view *)0x0) {
        return 0xffffffffffffffff;
      }
    }
    this_local = local_30;
  }
  return (size_type)this_local;
}

Assistant:

string_view::size_type string_view::rfind(char c, size_type pos) const
    noexcept {
  // Note: memrchr() is not available on Windows.
  if (empty()) return npos;
  for (size_type i = std::min(pos, length_ - 1);; --i) {
    if (ptr_[i] == c) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}